

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSeparateShaderTests.cpp
# Opt level: O2

vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_> *
deqp::gles31::Functional::anon_unknown_0::varyingCompatVtxOutputs
          (vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
           *__return_storage_ptr__,VaryingInterface *varyings)

{
  pointer pVVar1;
  size_t i;
  ulong uVar2;
  long lVar3;
  
  std::vector<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>::vector
            (__return_storage_ptr__,&varyings->vtxOutputs);
  lVar3 = 0x40;
  for (uVar2 = 0;
      pVVar1 = (__return_storage_ptr__->
               super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
               )._M_impl.super__Vector_impl_data._M_start,
      uVar2 < (ulong)(((long)(__return_storage_ptr__->
                             super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                             )._M_impl.super__Vector_impl_data._M_finish - (long)pVVar1) / 0x60);
      uVar2 = uVar2 + 1) {
    *(undefined4 *)((long)pVVar1 + lVar3 + -0x2c) =
         *(undefined4 *)
          ((long)(varyings->frgInputs).
                 super__Vector_base<glu::VariableDeclaration,_std::allocator<glu::VariableDeclaration>_>
                 ._M_impl.super__Vector_impl_data._M_start + lVar3 + -0x2c);
    std::__cxx11::string::_M_assign((string *)((long)&(pVVar1->layout).location + lVar3));
    lVar3 = lVar3 + 0x60;
  }
  return __return_storage_ptr__;
}

Assistant:

vector<VariableDeclaration> varyingCompatVtxOutputs (const VaryingInterface& varyings)
{
	vector<VariableDeclaration> outputs = varyings.vtxOutputs;

	for (size_t i = 0; i < outputs.size(); ++i)
	{
		outputs[i].interpolation = varyings.frgInputs[i].interpolation;
		outputs[i].name = varyings.frgInputs[i].name;
	}

	return outputs;
}